

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-example1.c
# Opt level: O2

wchar_t main(void)

{
  wchar_t *code_out;
  char *plaintext_out;
  size_t length_in;
  ptrdiff_t pVar1;
  
  code_out = (wchar_t *)malloc(0x400);
  plaintext_out = (char *)malloc(0x100);
  setlocale(6,"");
  rcnb_encode("The Quick Brown RC Jumps Over the NB Dog.",0x29,code_out);
  wprintf(anon_var_dwarf_72,code_out);
  length_in = wcslen(code_out);
  pVar1 = rcnb_decode(code_out,length_in,plaintext_out);
  if (pVar1 < 0) {
    wprintf(anon_var_dwarf_88);
  }
  printf("decoded: %s\n",plaintext_out);
  free(code_out);
  free(plaintext_out);
  return L'\0';
}

Assistant:

int main()
{
    const char* input = "The Quick Brown RC Jumps Over the NB Dog.";
    const wchar_t* rcnb_contrast = L"ȐčnÞȒċƝÞȐĈnƁȒȼǹþȓĆǹƃřČŇbȓƇńƄȓċȵƀȐĉņþŕƇNƅɌĉŇBȓƈȠßŕƇŃBɌċnþȓȼǸƅɌćÑbȒċƝÞƦȻƝƃŕƇNbȓƇNþŕC";
    wchar_t* encoded = malloc(SIZE * sizeof(wchar_t));
    char* decoded = malloc(SIZE);

    setlocale(LC_ALL, "");

    /* encode the data */
    rcnb_encode(input, strlen(input), encoded);
    wprintf(L"encoded: %ls\n", encoded);

    /* decode the data */
    ptrdiff_t res = rcnb_decode(encoded, wcslen(encoded), decoded);
    if (res < 0)
        wprintf(L"decode failed\n");
    printf("decoded: %s\n", decoded);

    /* compare the original and decoded data */
    assert(strcmp(input, decoded) == 0);
    assert(wcscmp(encoded, rcnb_contrast) == 0);

    free(encoded);
    free(decoded);
    return 0;
}